

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O0

int lws_buflist_linear_copy(lws_buflist **head,size_t ofs,uint8_t *buf,size_t len)

{
  lws_buflist *local_40;
  size_t s;
  uint8_t *obuf;
  lws_buflist *p;
  size_t len_local;
  uint8_t *buf_local;
  size_t ofs_local;
  lws_buflist **head_local;
  
  p = (lws_buflist *)len;
  len_local = (size_t)buf;
  buf_local = (uint8_t *)ofs;
  for (obuf = (uint8_t *)*head; obuf != (uint8_t *)0x0 && p != (lws_buflist *)0x0;
      obuf = *(uint8_t **)obuf) {
    if (buf_local < *(uint8_t **)(obuf + 8)) {
      local_40 = (lws_buflist *)(*(long *)(obuf + 8) - (long)buf_local);
      if (p < local_40) {
        local_40 = p;
      }
      memcpy((void *)len_local,obuf + 0x28 + (long)buf_local,(size_t)local_40);
      p = (lws_buflist *)((long)p - (long)local_40);
      len_local = (long)&local_40->next + len_local;
      buf_local = (uint8_t *)0x0;
    }
    else {
      buf_local = buf_local + -*(long *)(obuf + 8);
    }
  }
  return (int)len_local - (int)buf;
}

Assistant:

int
lws_buflist_linear_copy(struct lws_buflist **head, size_t ofs, uint8_t *buf,
			size_t len)
{
	struct lws_buflist *p = *head;
	uint8_t *obuf = buf;
	size_t s;

	while (p && len) {
		if (ofs < p->len) {
			s = p->len - ofs;
			if (s > len)
				s = len;
			memcpy(buf, ((uint8_t *)&p[1]) + LWS_PRE + ofs, s);
			len -= s;
			buf += s;
			ofs = 0;
		} else
			ofs -= p->len;
		p = p->next;
	}

	return lws_ptr_diff(buf, obuf);
}